

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOArrayLengthTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOArrayLengthCase::deinit(SSBOArrayLengthCase *this)

{
  ShaderProgram *this_00;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SSBOArrayLengthCase *this_local;
  
  if (this->m_shader != (ShaderProgram *)0x0) {
    this_00 = this->m_shader;
    if (this_00 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(this_00);
      operator_delete(this_00,0xd0);
    }
    this->m_shader = (ShaderProgram *)0x0;
  }
  if (this->m_targetBufferID != 0) {
    pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_targetBufferID);
    this->m_targetBufferID = 0;
  }
  if (this->m_outputBufferID != 0) {
    pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x438))(1,&this->m_outputBufferID);
    this->m_outputBufferID = 0;
  }
  return;
}

Assistant:

void SSBOArrayLengthCase::deinit (void)
{
	if (m_shader)
	{
		delete m_shader;
		m_shader = DE_NULL;
	}

	if (m_targetBufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_targetBufferID);
		m_targetBufferID = 0;
	}

	if (m_outputBufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_outputBufferID);
		m_outputBufferID = 0;
	}
}